

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_set.h
# Opt level: O0

size_t __thiscall
spvtools::EnumSet<spvtools::Extension>::FindBucketForValue
          (EnumSet<spvtools::Extension> *this,Extension value)

{
  size_type sVar1;
  unsigned_long *puVar2;
  const_reference pvVar3;
  size_t local_38;
  unsigned_long local_30;
  size_type local_28;
  size_t index;
  Extension wanted_start;
  Extension value_local;
  EnumSet<spvtools::Extension> *this_local;
  
  index._4_4_ = value;
  _wanted_start = this;
  sVar1 = std::
          vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
          ::size(&this->buckets_);
  if (sVar1 == 0) {
    this_local = (EnumSet<spvtools::Extension> *)0x0;
  }
  else {
    index._0_4_ = ComputeBucketStart(index._4_4_);
    sVar1 = std::
            vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
            ::size(&this->buckets_);
    if (sVar1 == 0) {
      __assert_fail("buckets_.size() > 0 && \"Size must not be 0 here. Has the code above changed?\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/enum_set.h"
                    ,0x18c,
                    "size_t spvtools::EnumSet<spvtools::Extension>::FindBucketForValue(T) const [T = spvtools::Extension]"
                   );
    }
    sVar1 = std::
            vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
            ::size(&this->buckets_);
    local_30 = sVar1 - 1;
    local_38 = ComputeLargestPossibleBucketIndexFor(index._4_4_);
    puVar2 = std::min<unsigned_long>(&local_30,&local_38);
    local_28 = *puVar2;
    while (pvVar3 = std::
                    vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                    ::operator[](&this->buckets_,local_28), (Extension)index <= pvVar3->start) {
      if (local_28 == 0) {
        return 0;
      }
      local_28 = local_28 - 1;
    }
    this_local = (EnumSet<spvtools::Extension> *)(local_28 + 1);
  }
  return (size_t)this_local;
}

Assistant:

size_t FindBucketForValue(T value) const {
    // Set is empty, insert at 0.
    if (buckets_.size() == 0) {
      return 0;
    }

    const T wanted_start = ComputeBucketStart(value);
    assert(buckets_.size() > 0 &&
           "Size must not be 0 here. Has the code above changed?");
    size_t index = std::min(buckets_.size() - 1,
                            ComputeLargestPossibleBucketIndexFor(value));

    // This loops behaves like std::upper_bound with a reverse iterator.
    // Buckets are sorted. 3 main cases:
    //  - The bucket matches
    //    => returns the bucket index.
    //  - The found bucket is larger
    //    => scans left until it finds the correct bucket, or insertion point.
    //  - The found bucket is smaller
    //    => We are at the end, so we return past-end index for insertion.
    for (; buckets_[index].start >= wanted_start; index--) {
      if (index == 0) {
        return 0;
      }
    }

    return index + 1;
  }